

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O1

void __thiscall xray_re::xr_way_object::save(xr_way_object *this,xr_writer *w)

{
  pointer pwVar1;
  pointer pwVar2;
  pointer point;
  pointer link;
  write_point_le local_2e;
  way_link_io local_2d;
  short local_2c;
  undefined2 local_2a;
  
  xr_custom_object::save(&this->super_xr_custom_object,w);
  xr_writer::w_raw_chunk(w,1,&WAYOBJECT_VERSION,2,false);
  xr_writer::open_chunk(w,2);
  local_2c = (short)((uint)(*(int *)&(this->m_points).
                                     super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->m_points).
                                    super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x6db7;
  (*w->_vptr_xr_writer[2])(w,&local_2c,2);
  point = (this->m_points).
          super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>._M_impl.
          super__Vector_impl_data._M_start;
  pwVar1 = (this->m_points).
           super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (point != pwVar1) {
    do {
      write_point_le::operator()(&local_2e,point,w);
      point = point + 1;
    } while (point != pwVar1);
  }
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,3);
  local_2a = (undefined2)
             ((uint)(*(int *)&(this->m_links).
                              super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->m_links).
                             super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  (*w->_vptr_xr_writer[2])(w,&local_2a,2);
  link = (this->m_links).super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>.
         _M_impl.super__Vector_impl_data._M_start;
  pwVar2 = (this->m_links).super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (link != pwVar2) {
    do {
      way_link_io::operator()(&local_2d,link,w);
      link = link + 1;
    } while (link != pwVar2);
  }
  xr_writer::close_chunk(w);
  xr_writer::w_raw_chunk(w,4,&this->m_type,4,false);
  return;
}

Assistant:

void xr_way_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);
	w.w_chunk<uint16_t>(WAYOBJECT_CHUNK_VERSION, WAYOBJECT_VERSION);

	w.open_chunk(WAYOBJECT_CHUNK_POINTS);
	w.w_size_u16(m_points.size());
	w.w_seq(m_points, write_point_le());
	w.close_chunk();

	w.open_chunk(WAYOBJECT_CHUNK_LINKS);
	w.w_size_u16(m_links.size());
	w.w_seq(m_links, way_link_io());
	w.close_chunk();

	w.w_chunk<uint32_t>(WAYOBJECT_CHUNK_TYPE, m_type);
}